

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O3

EmitInfo __thiscall Wasm::WasmBytecodeGenerator::EmitSetLocal(WasmBytecodeGenerator *this,bool tee)

{
  uint uVar1;
  EmitInfoBase EVar2;
  WasmType expectedType;
  IWasmByteCodeWriter *pIVar3;
  OpCodeAsmJs OVar4;
  uint32 uVar5;
  WasmBinaryReader *pWVar6;
  EmitInfo EVar7;
  WasmCompilationException *this_00;
  EmitInfo local_38;
  EmitInfo info;
  
  pWVar6 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  if (pWVar6 == (WasmBinaryReader *)0x0) {
    pWVar6 = (this->m_module->m_reader).ptr;
  }
  uVar1 = (pWVar6->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets;
  uVar5 = WasmFunctionInfo::GetLocalCount(this->m_funcInfo);
  if (uVar1 < uVar5) {
    EVar2.location = this->m_locals[uVar1].location;
    expectedType = this->m_locals[uVar1].type;
    EVar7 = PopEvalStack(this,expectedType,(char16 *)0x0);
    pIVar3 = this->m_writer;
    local_38 = EVar7;
    OVar4 = GetLoadOp(this,expectedType);
    (*pIVar3->_vptr_IWasmByteCodeWriter[0xf])
              (pIVar3,(ulong)OVar4,(ulong)EVar2.location,(ulong)EVar7 & 0xffffffff);
    if (tee) {
      local_38 = EVar7;
      if (EVar7.type == Any) {
        local_38.type = expectedType;
        local_38.super_EmitInfoBase.location = EVar2.location;
      }
    }
    else {
      ReleaseLocation(this,&local_38);
      local_38.super_EmitInfoBase.location = 0xffffffff;
      local_38.type = Void;
    }
    return local_38;
  }
  this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
  WasmCompilationException::WasmCompilationException
            (this_00,L"%u is not a valid local",(ulong)uVar1);
  __cxa_throw(this_00,&WasmCompilationException::typeinfo,
              WasmCompilationException::~WasmCompilationException);
}

Assistant:

EmitInfo WasmBytecodeGenerator::EmitSetLocal(bool tee)
{
    uint32 localNum = GetReader()->m_currentNode.var.num;
    if (localNum >= m_funcInfo->GetLocalCount())
    {
        throw WasmCompilationException(_u("%u is not a valid local"), localNum);
    }

    WasmLocal local = m_locals[localNum];

    EmitInfo info = PopEvalStack(local.type);

    m_writer->AsmReg2(GetLoadOp(local.type), local.location, info.location);

    if (tee)
    {
        if (info.type == WasmTypes::Any)
        {
            info.location = local.location;
            info.type = local.type;
        }
        return info;
    }
    else
    {
        ReleaseLocation(&info);
        return EmitInfo();
    }
}